

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O3

void __thiscall
xLearn::DMATRIX_TEST_ReAlloc_Test::~DMATRIX_TEST_ReAlloc_Test(DMATRIX_TEST_ReAlloc_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DMATRIX_TEST, ReAlloc) {
  DMatrix matrix;
  matrix.ReAlloc(kLength, false);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, kLength);
  EXPECT_EQ(matrix.row.size(), kLength);
  EXPECT_EQ(matrix.Y.size(), kLength);
  EXPECT_EQ(matrix.norm.size(), kLength);
  EXPECT_EQ(matrix.has_label, false);
  EXPECT_EQ(matrix.pos, 0);
}